

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::objectivec::ReadLine(StringPiece *input,StringPiece *line)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_t size;
  bool bVar5;
  
  uVar4 = input->length_;
  bVar5 = uVar4 != 0;
  if (bVar5) {
    uVar3 = 0;
    do {
      cVar1 = input->ptr_[uVar3];
      if ((cVar1 == '\r') || (cVar1 == '\n')) {
        line->ptr_ = input->ptr_;
        line->length_ = uVar3;
        uVar4 = (ulong)((int)uVar3 + 1);
        pcVar2 = input->ptr_;
        size = input->length_ - uVar4;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        input->ptr_ = pcVar2 + uVar4;
        input->length_ = size;
        return bVar5;
      }
      uVar3 = uVar3 + 1;
      bVar5 = uVar3 < uVar4;
    } while (uVar4 != uVar3);
  }
  return bVar5;
}

Assistant:

bool ReadLine(StringPiece* input, StringPiece* line) {
  for (int len = 0; len < input->size(); ++len) {
    if (ascii_isnewline((*input)[len])) {
      *line = StringPiece(input->data(), len);
      ++len;  // advance over the newline
      *input = StringPiece(input->data() + len, input->size() - len);
      return true;
    }
  }
  return false;  // Ran out of input with no newline.
}